

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::GenMatcher::init<Kernel::Literal*>
          (GenMatcher *this,Literal *query,uint nextSpecVar)

{
  uint uVar1;
  size_t sVar2;
  uint in_EDX;
  size_t in_RSI;
  Stack<unsigned_int> *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  Stack<unsigned_int> *pSVar3;
  uint local_18;
  uint local_14;
  
  local_14 = in_EDX;
  pSVar3 = in_RDI;
  Lib::Stack<unsigned_int>::reset(in_RDI);
  Lib::ArrayMap<Kernel::TermList>::reset((ArrayMap<Kernel::TermList> *)(in_RDI + 2));
  uVar1 = weight((Literal *)0x336249);
  *(uint *)&in_RDI[1]._end = uVar1 - 1;
  sVar2 = Lib::DArray<Kernel::TermList>::size((DArray<Kernel::TermList> *)(in_RDI + 1));
  if (sVar2 < local_14) {
    sVar2 = Lib::DArray<Kernel::TermList>::size((DArray<Kernel::TermList> *)(in_RDI + 1));
    local_18 = (uint)(sVar2 << 1);
    std::max<unsigned_int>(&local_18,&local_14);
    Lib::DArray<Kernel::TermList>::ensure((DArray<Kernel::TermList> *)pSVar3,in_RSI);
  }
  pSVar3 = in_RDI + 2;
  weight((Literal *)0x3362bc);
  Lib::ArrayMap<Kernel::TermList>::ensure
            ((ArrayMap<Kernel::TermList> *)pSVar3,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void init(TermOrLit query, unsigned nextSpecVar)
      {
        _boundVars.reset();
        // _specVars->reset(); <- does not need to be reset as we only write before we read 
        _bindings.reset();

        _maxVar = weight(query) - 1;
        if(_specVars.size()<nextSpecVar) {
          //_specVars can get really big, but it was introduced instead of hash table
          //during optimizations, as it raised performance by abour 5%.
          _specVars.ensure(std::max(static_cast<unsigned>(_specVars.size()*2), nextSpecVar));
        }
        _bindings.ensure(weight(query));
      }